

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_true,_false>::append_edge_(DaTrie<false,_true,_false> *this,Query *query)

{
  byte bVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  reference this_00;
  Query *this_01;
  reference pvVar6;
  Query *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t child_pos;
  uint32_t base;
  uint32_t node_pos;
  vector<ddd::Block,_std::allocator<ddd::Block>_> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *this_02;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  uVar2 = (uint8_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  Query::label(in_RSI);
  uVar3 = xcheck_((DaTrie<false,_true,_false> *)
                  CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),uVar2,
                  in_stack_ffffffffffffffc0);
  node_pos = uVar3;
  bVar1 = Query::label(in_RSI);
  uVar4 = node_pos ^ bVar1;
  fix_((DaTrie<false,_true,_false> *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
       (uint32_t)((ulong)in_RDI >> 0x20),
       (vector<ddd::Block,_std::allocator<ddd::Block>_> *)
       CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  uVar5 = Query::node_pos(in_RSI);
  this_00 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar5);
  Bc::set_base(this_00,uVar3);
  this_01 = (Query *)std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar4)
  ;
  uVar3 = Query::node_pos(in_RSI);
  Bc::set_check((Bc *)this_01,uVar3);
  uVar2 = Query::label(in_RSI);
  this_02 = in_RDI + 3;
  uVar3 = Query::node_pos(in_RSI);
  pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)this_02,(ulong)uVar3)
  ;
  pvVar6->child = uVar2;
  uVar2 = Query::label(in_RSI);
  pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)uVar4);
  pvVar6->sib = uVar2;
  Query::next(this_01,node_pos);
  return;
}

Assistant:

void append_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto base = xcheck_(query.label(), blocks_);
    auto child_pos = base ^query.label();

    fix_(child_pos, blocks_);
    bc_[query.node_pos()].set_base(base);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      node_links_[query.node_pos()].child = query.label();
      node_links_[child_pos].sib = query.label();
    }
    query.next(child_pos);
  }